

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall Matrix::operator+(Matrix *this,Matrix *other)

{
  int cols;
  int rows;
  double *pdVar1;
  long lVar2;
  double *data;
  runtime_error *this_00;
  long *in_RDX;
  ulong uVar3;
  uint uVar4;
  Matrix MVar5;
  
  cols = other->cols;
  if ((*(int *)((long)in_RDX + 0xc) == cols) && (rows = other->rows, (int)in_RDX[1] == rows)) {
    uVar4 = rows * cols;
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)uVar4) {
      uVar3 = (long)(int)uVar4 * 8;
    }
    data = (double *)operator_new__(uVar3);
    if (0 < (int)uVar4) {
      pdVar1 = other->data;
      lVar2 = *in_RDX;
      uVar3 = 0;
      do {
        data[uVar3] = pdVar1[uVar3] + *(double *)(lVar2 + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    MVar5 = FromArray(this,data,rows,cols);
    MVar5.data = (double *)this;
    return MVar5;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matrix Matrix::operator+(const Matrix& other) const
{
    if (other.cols != cols || other.rows != rows)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    auto* aData = new double[rows * cols];
    for (int i = 0; i < rows * cols; ++i)
    {
        aData[i] = data[i] + other.data[i];
    }

    return FromArray(aData, rows, cols);
}